

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qmessagebox.cpp
# Opt level: O1

void QMessageBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QFlagsStorage<QDialogButtonBox::StandardButton> *pQVar1;
  QPixmap *pixmap;
  QMessageBoxPrivate *this;
  QWidgetData *pQVar2;
  qsizetype qVar3;
  undefined8 uVar4;
  QFlagsStorage<QDialogButtonBox::StandardButton> QVar5;
  QArrayData *pQVar6;
  long in_FS_OFFSET;
  undefined1 local_70 [24];
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (_id == 0 && _c == InvokeMetaMethod) {
    local_70._0_8_ = *_a[1];
    local_58.d.ptr = (char16_t *)local_70;
    local_58.d.d = (Data *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,0,(void **)&local_58);
  }
  if (_c != ReadProperty) {
    if (_c == WriteProperty) {
      if ((uint)_id < 9) {
        pixmap = (QPixmap *)*_a;
        switch(_id) {
        case 0:
          setText((QMessageBox *)_o,(QString *)pixmap);
          break;
        case 1:
          setIcon((QMessageBox *)_o,*(Icon *)pixmap);
          break;
        case 2:
          this = *(QMessageBoxPrivate **)(_o + 8);
          QLabel::setPixmap(this->iconLabel,pixmap);
          this->icon = NoIcon;
          QMessageBoxPrivate::setupLayout(this);
          break;
        case 3:
          setTextFormat((QMessageBox *)_o,*(TextFormat *)pixmap);
          break;
        case 4:
          setStandardButtons((QMessageBox *)_o,
                             (QFlagsStorageHelper<QMessageBox::StandardButton,_4>)
                             *(QFlagsStorageHelper<QMessageBox::StandardButton,_4> *)pixmap);
          break;
        case 5:
          setDetailedText((QMessageBox *)_o,(QString *)pixmap);
          break;
        case 6:
          setInformativeText((QMessageBox *)_o,(QString *)pixmap);
          break;
        case 7:
          QLabel::setTextInteractionFlags
                    (*(QLabel **)(*(long *)(_o + 8) + 0x2e0),
                     (QFlagsStorageHelper<Qt::TextInteractionFlag,_4>)
                     *(QFlagsStorageHelper<Qt::TextInteractionFlag,_4> *)pixmap);
          break;
        case 8:
          setOptions((QMessageBox *)_o,
                     (QFlagsStorageHelper<QMessageBox::Option,_4>)
                     *(QFlagsStorageHelper<QMessageBox::Option,_4> *)pixmap);
        }
      }
    }
    else if (((_c == IndexOfMethod) && (*_a[1] == buttonClicked)) &&
            (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
    goto LAB_0050f258;
  }
  if (8 < (uint)_id) goto LAB_0050f258;
  pQVar1 = (QFlagsStorage<QDialogButtonBox::StandardButton> *)*_a;
  switch(_id) {
  case 0:
    QLabel::text(&local_58,*(QLabel **)(*(long *)(_o + 8) + 0x2e0));
    pQVar6 = *(QArrayData **)pQVar1;
    *(Data **)pQVar1 = local_58.d.d;
    pQVar2 = *(QWidgetData **)(pQVar1 + 2);
    *(char16_t **)(pQVar1 + 2) = local_58.d.ptr;
    qVar3 = *(qsizetype *)(pQVar1 + 4);
    *(qsizetype *)(pQVar1 + 4) = local_58.d.size;
    local_58.d.ptr = (char16_t *)pQVar2;
    local_58.d.size = qVar3;
    goto LAB_0050f2c2;
  case 1:
    QVar5.i = *(Int *)(*(long *)(_o + 8) + 0x2e8);
    break;
  case 2:
    QLabel::pixmap((QLabel *)local_70);
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)&local_58);
    uVar4 = local_70._16_8_;
    local_58.d.d = (Data *)QDataStream::operator<<;
    local_70._16_8_ = 0;
    local_58.d.size = *(qsizetype *)(pQVar1 + 4);
    *(undefined8 *)(pQVar1 + 4) = uVar4;
    QPixmap::~QPixmap((QPixmap *)&local_58);
    QPixmap::~QPixmap((QPixmap *)local_70);
    goto LAB_0050f258;
  case 3:
    QVar5.i = QLabel::textFormat(*(QLabel **)(*(long *)(_o + 8) + 0x2e0));
    break;
  case 4:
    QVar5.i = (Int)QDialogButtonBox::standardButtons
                             (*(QDialogButtonBox **)(*(long *)(_o + 8) + 0x2f8));
    break;
  case 5:
    if (*(long *)(*(long *)(_o + 8) + 0x340) == 0) {
LAB_0050f27b:
      local_58.d.d = (Data *)0x0;
      local_58.d.ptr = (char16_t *)0x0;
      local_58.d.size = 0;
    }
    else {
      QTextEdit::toPlainText(&local_58,*(QTextEdit **)(*(long *)(*(long *)(_o + 8) + 0x340) + 0x30))
      ;
    }
    goto LAB_0050f28c;
  case 6:
    if (*(QLabel **)(*(long *)(_o + 8) + 0x358) == (QLabel *)0x0) goto LAB_0050f27b;
    QLabel::text(&local_58,*(QLabel **)(*(long *)(_o + 8) + 0x358));
LAB_0050f28c:
    pQVar6 = *(QArrayData **)pQVar1;
    *(Data **)pQVar1 = local_58.d.d;
    pQVar2 = *(QWidgetData **)(pQVar1 + 2);
    *(char16_t **)(pQVar1 + 2) = local_58.d.ptr;
    qVar3 = *(qsizetype *)(pQVar1 + 4);
    *(qsizetype *)(pQVar1 + 4) = local_58.d.size;
    local_58.d.ptr = (char16_t *)pQVar2;
    local_58.d.size = qVar3;
LAB_0050f2c2:
    local_58.d.d = (Data *)pQVar6;
    if (pQVar6 != (QArrayData *)0x0) {
      LOCK();
      (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar6,2,0x10);
      }
    }
    goto LAB_0050f258;
  case 7:
    QVar5.i = (Int)QLabel::textInteractionFlags(*(QLabel **)(*(long *)(_o + 8) + 0x2e0));
    break;
  case 8:
    QVar5.i = QMessageDialogOptions::options();
  }
  pQVar1->i = QVar5.i;
LAB_0050f258:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMessageBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QMessageBox *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->buttonClicked((*reinterpret_cast< std::add_pointer_t<QAbstractButton*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QMessageBox::*)(QAbstractButton * )>(_a, &QMessageBox::buttonClicked, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->text(); break;
        case 1: *reinterpret_cast<Icon*>(_v) = _t->icon(); break;
        case 2: *reinterpret_cast<QPixmap*>(_v) = _t->iconPixmap(); break;
        case 3: *reinterpret_cast<Qt::TextFormat*>(_v) = _t->textFormat(); break;
        case 4: QtMocHelpers::assignFlags<StandardButtons>(_v, _t->standardButtons()); break;
        case 5: *reinterpret_cast<QString*>(_v) = _t->detailedText(); break;
        case 6: *reinterpret_cast<QString*>(_v) = _t->informativeText(); break;
        case 7: *reinterpret_cast<Qt::TextInteractionFlags*>(_v) = _t->textInteractionFlags(); break;
        case 8: *reinterpret_cast<Options*>(_v) = _t->options(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setText(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setIcon(*reinterpret_cast<Icon*>(_v)); break;
        case 2: _t->setIconPixmap(*reinterpret_cast<QPixmap*>(_v)); break;
        case 3: _t->setTextFormat(*reinterpret_cast<Qt::TextFormat*>(_v)); break;
        case 4: _t->setStandardButtons(*reinterpret_cast<StandardButtons*>(_v)); break;
        case 5: _t->setDetailedText(*reinterpret_cast<QString*>(_v)); break;
        case 6: _t->setInformativeText(*reinterpret_cast<QString*>(_v)); break;
        case 7: _t->setTextInteractionFlags(*reinterpret_cast<Qt::TextInteractionFlags*>(_v)); break;
        case 8: _t->setOptions(*reinterpret_cast<Options*>(_v)); break;
        default: break;
        }
    }
}